

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocator.cpp
# Opt level: O1

void __thiscall
xscript::parser::register_allocator::register_allocator(register_allocator *this,int32_t max)

{
  _Elt_pointer piVar1;
  bool bVar2;
  int iVar3;
  int local_24;
  
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)0x0;
  (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)this,0);
  if (0 < max) {
    iVar3 = max + -1;
    do {
      piVar1 = (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar1 == (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)this,&local_24);
      }
      else {
        *piVar1 = iVar3;
        (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur = piVar1 + 1;
      }
      bVar2 = 0 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar2);
    return;
  }
  __assert_fail("max > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/register_allocator.cpp"
                ,0xb,"xscript::parser::register_allocator::register_allocator(int32_t)");
}

Assistant:

register_allocator::register_allocator(int32_t max) {
    assert(max > 0);
    
    for (int32_t i = max-1 ; i >= 0 ; i--) {
        regs.push(i);
    }
}